

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo_loop.cpp
# Opt level: O3

void __thiscall
pseudo_loop::compute_VP(pseudo_loop *this,cand_pos_t i,cand_pos_t j,sparse_tree *tree)

{
  int iVar1;
  pointer pNVar2;
  pointer piVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  energy_t eVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int *piVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  int local_d0;
  int local_7c;
  int local_40 [4];
  
  lVar23 = (long)i;
  iVar1 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar23];
  uVar5 = sparse_tree::Bp(tree,i,j);
  uVar6 = sparse_tree::B(tree,i,j);
  uVar7 = sparse_tree::b(tree,i,j);
  uVar8 = sparse_tree::bp(tree,i,j);
  pNVar2 = (tree->tree).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar14 = (pNVar2[lVar23].parent)->index;
  iVar17 = (pNVar2[j].parent)->index;
  iVar29 = 10000000;
  uVar26 = ~i;
  iVar27 = 10000000;
  if ((((0 < iVar14) && ((int)uVar8 < 0)) && (-1 < (int)(uVar6 | uVar5))) && (iVar17 < iVar14)) {
    iVar27 = 0;
    iVar18 = 0;
    if (i < (int)(uVar5 - 1)) {
      iVar18 = (this->WI).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [(int)((uVar5 - 1) + uVar26 +
                     (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar23 + 1])];
    }
    if ((int)uVar6 < j + -1) {
      iVar27 = (this->WI).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [(int)(j + -1 + ~uVar6 +
                     (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)(int)uVar6 + 1])];
    }
    iVar27 = iVar27 + iVar18;
  }
  if (((iVar14 < iVar17) && ((int)uVar5 < 0)) && ((-1 < (int)(uVar8 | uVar7) && (0 < iVar17)))) {
    iVar29 = 0;
    iVar18 = 0;
    if (i < (int)(uVar7 - 1)) {
      iVar18 = (this->WI).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [(int)((uVar7 - 1) + uVar26 +
                     (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar23 + 1])];
    }
    if ((int)uVar8 < j + -1) {
      iVar29 = (this->WI).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [(int)(j + -1 + ~uVar8 +
                     (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)(int)uVar8 + 1])];
    }
    iVar29 = iVar29 + iVar18;
  }
  iVar22 = 10000000;
  iVar18 = 10000000;
  if (((0 < iVar14) && (-1 < (int)(uVar6 | uVar5 | uVar7 | uVar8))) && (0 < iVar17)) {
    iVar17 = 0;
    iVar14 = 0;
    if (i < (int)(uVar5 - 1)) {
      iVar14 = (this->WI).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [(int)((uVar5 - 1) + uVar26 +
                     (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar23 + 1])];
    }
    if ((int)uVar6 < (int)(uVar7 - 1)) {
      iVar17 = (this->WI).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [(int)((uVar7 - 1) + ~uVar6 +
                     (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)(int)uVar6 + 1])];
    }
    iVar18 = 0;
    if ((int)uVar8 < j + -1) {
      iVar18 = (this->WI).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [(int)(j + -1 + ~uVar8 +
                     (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)(int)uVar8 + 1])];
    }
    iVar18 = iVar17 + iVar14 + iVar18;
  }
  lVar23 = lVar23 + 1;
  iVar14 = j + -1;
  lVar21 = (long)iVar14;
  local_d0 = (int)lVar23;
  if (((pNVar2[lVar23].pair < -1) && (pNVar2[lVar21].pair < -1)) &&
     (0 < (short)pair[this->S_[lVar23]][this->S_[lVar21]])) {
    eVar9 = get_e_stP(this,i,j);
    iVar22 = 10000000;
    if (local_d0 < iVar14) {
      iVar22 = (this->VP).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [(int)(uVar26 + iVar14 +
                     (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar23])];
    }
    iVar22 = iVar22 + eVar9;
  }
  if (uVar7 < uVar5) {
    uVar5 = uVar7;
  }
  uVar7 = i + 0x1fU;
  if ((int)(j - 4U) < (int)(i + 0x1fU)) {
    uVar7 = j - 4U;
  }
  if ((int)uVar5 <= (int)uVar7) {
    uVar7 = uVar5;
  }
  local_7c = 10000000;
  iVar17 = 10000000;
  if (local_d0 < (int)uVar7) {
    if ((int)uVar6 < (int)uVar8) {
      uVar6 = uVar8;
    }
    iVar19 = (j - i) + -2;
    lVar24 = lVar23;
    do {
      if (((tree->tree).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_start[lVar24].pair < -1) &&
         (iVar15 = (int)lVar24,
         (int)(uVar26 + iVar15) <=
         (tree->up).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[lVar24 + -1])) {
        iVar10 = (j - i) + -0x20 + iVar15;
        if (iVar10 < (int)(uVar6 + 1)) {
          iVar10 = uVar6 + 1;
        }
        if (iVar10 < iVar14) {
          iVar25 = 0;
          uVar16 = lVar21 << 5 | 6;
          lVar30 = lVar21;
          iVar28 = iVar19;
          do {
            iVar11 = iVar17;
            if (((*(int *)((long)&((tree->tree).super__Vector_base<Node,_std::allocator<Node>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->parent + uVar16 * 2) <
                  -1) && (0 < (short)pair[this->S_[lVar24]][this->S_[lVar30]])) &&
               (iVar25 <= (tree->up).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar21])) {
              eVar9 = compute_int(this,i,j,iVar15,(cand_pos_t)lVar30,this->params_);
              lVar12 = lrint((double)eVar9 * e_intP_penalty);
              iVar11 = 10000000;
              if (lVar24 < lVar30) {
                iVar11 = (this->VP).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start
                         [(this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar24] + iVar28];
              }
              iVar11 = (int)lVar12 + iVar11;
              if (iVar17 <= iVar11) {
                iVar11 = iVar17;
              }
            }
            iVar17 = iVar11;
            lVar30 = lVar30 + -1;
            uVar16 = uVar16 - 0x20;
            iVar28 = iVar28 + -1;
            iVar25 = iVar25 + 1;
          } while (iVar10 < lVar30);
        }
      }
      lVar24 = lVar24 + 1;
      iVar19 = iVar19 + -1;
    } while (uVar7 != (uint)lVar24);
  }
  uVar5 = sparse_tree::b(tree,i,j);
  uVar6 = sparse_tree::Bp(tree,i,j);
  if (uVar6 < uVar5) {
    uVar5 = uVar6;
  }
  uVar7 = sparse_tree::B(tree,i,j);
  uVar6 = sparse_tree::bp(tree,i,j);
  if ((int)uVar6 < (int)uVar7) {
    uVar6 = uVar7;
  }
  if (local_d0 < (int)uVar5) {
    piVar3 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar14 = (j - i) + -2;
    iVar19 = -1;
    lVar24 = lVar23;
    do {
      local_7c = 10000000;
      iVar15 = 10000000;
      if (lVar23 < lVar24 + -1) {
        iVar15 = (this->WIP).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[piVar3[lVar23] + iVar19];
      }
      if (lVar24 < lVar21) {
        local_7c = (this->VP).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[piVar3[lVar24] + iVar14];
      }
      lVar24 = lVar24 + 1;
      iVar14 = iVar14 + -1;
      iVar10 = (i - uVar5) + iVar19;
      iVar19 = iVar19 + 1;
    } while (iVar10 != -3);
    local_7c = local_7c + iVar15;
  }
  iVar15 = uVar6 + 1;
  iVar19 = 10000000;
  lVar24 = (long)iVar15;
  iVar14 = 10000000;
  if (iVar15 < j) {
    piVar3 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar10 = (j - uVar6) + -3;
    iVar14 = 10000000;
    lVar30 = 0;
    do {
      iVar28 = 10000000;
      if (lVar23 < lVar24 + lVar30) {
        iVar28 = (this->VP).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)((uVar6 - i) + (int)lVar30 + piVar3[lVar23])]
        ;
      }
      iVar25 = 10000000;
      if (lVar24 + lVar30 + 1 < lVar21) {
        iVar25 = (this->WIP).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[piVar3[lVar24 + lVar30 + 1] + iVar10];
      }
      iVar11 = iVar25 + iVar28;
      if (iVar14 <= iVar25 + iVar28) {
        iVar11 = iVar14;
      }
      iVar14 = iVar11;
      iVar10 = iVar10 + -1;
      lVar30 = lVar30 + 1;
    } while (~uVar6 + j != (int)lVar30);
  }
  iVar10 = ap_penalty + bp_penalty * 2;
  if (local_d0 < (int)uVar5) {
    piVar3 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar28 = (j - i) + -2;
    iVar19 = 10000000;
    iVar25 = -1;
    lVar30 = lVar23;
    do {
      iVar11 = 10000000;
      if (lVar23 < lVar30 + -1) {
        iVar11 = (this->WIP).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[piVar3[lVar23] + iVar25];
      }
      iVar20 = 10000000;
      if (lVar30 < lVar21) {
        iVar20 = (this->VPR).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[piVar3[lVar30] + iVar28];
      }
      iVar4 = iVar20 + iVar11;
      if (iVar19 <= iVar20 + iVar11) {
        iVar4 = iVar19;
      }
      iVar19 = iVar4;
      lVar30 = lVar30 + 1;
      iVar28 = iVar28 + -1;
      iVar11 = (i - uVar5) + iVar25;
      iVar25 = iVar25 + 1;
    } while (iVar11 != -3);
  }
  iVar28 = 10000000;
  if (iVar15 < j) {
    piVar3 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar15 = (j - uVar6) + -3;
    iVar28 = 10000000;
    lVar30 = 0;
    do {
      iVar25 = 10000000;
      if (lVar23 < lVar24 + lVar30) {
        iVar25 = (this->VPL).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)((uVar6 - i) + (int)lVar30 + piVar3[lVar23])]
        ;
      }
      iVar11 = 10000000;
      if (lVar24 + lVar30 + 1 < lVar21) {
        iVar11 = (this->WIP).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[piVar3[lVar24 + lVar30 + 1] + iVar15];
      }
      iVar20 = iVar11 + iVar25;
      if (iVar28 <= iVar11 + iVar25) {
        iVar20 = iVar28;
      }
      iVar28 = iVar20;
      iVar15 = iVar15 + -1;
      lVar30 = lVar30 + 1;
    } while (~uVar6 + j != (int)lVar30);
  }
  local_40[0] = local_7c + iVar10;
  piVar13 = local_40;
  local_40[1] = iVar14 + iVar10;
  local_40[2] = iVar19 + iVar10;
  local_40[3] = iVar28 + iVar10;
  lVar23 = 4;
  do {
    iVar14 = *(int *)((long)local_40 + lVar23);
    if (iVar14 < local_40[0]) {
      piVar13 = (int *)((long)local_40 + lVar23);
      local_40[0] = iVar14;
    }
    lVar23 = lVar23 + 4;
  } while (lVar23 != 0x10);
  if (iVar17 < iVar22) {
    iVar22 = iVar17;
  }
  if (iVar29 < iVar27) {
    iVar27 = iVar29;
  }
  if (iVar18 < iVar27) {
    iVar27 = iVar18;
  }
  if (iVar22 < iVar27) {
    iVar27 = iVar22;
  }
  if (*piVar13 < iVar27) {
    iVar27 = *piVar13;
  }
  (this->VP).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [(j - i) + iVar1] = iVar27;
  return;
}

Assistant:

void pseudo_loop::compute_VP(cand_pos_t i, cand_pos_t j, sparse_tree &tree){
	cand_pos_t ij = index[i]+j-i;

	const pair_type ptype_closing = pair[S_[i]][S_[j]];	
	
	energy_t m1 = INF, m2 = INF, m3 = INF, m4= INF, m5 = INF, m6 = INF, m7 = INF, m8 = INF, m9 = INF; //different branches
	
	// Borders -- added one to i and j to make it fit current bounds but also subtracted 1 from answer as the tree bounds are shifted as well
	cand_pos_t Bp_ij = tree.Bp(i,j);
	cand_pos_t B_ij = tree.B(i,j);
	cand_pos_t b_ij = tree.b(i,j);
	cand_pos_t bp_ij = tree.bp(i,j);
	
	//branchs:
	// 1) inArc(i) and NOT_inArc(j)
	// WI(i+1)(B'(i,j)-1)+WI(B(i,j)+1)(j-1)

	// Hosna April 9th, 2007
	// need to check the borders as they may be negative
	if((tree.tree[i].parent->index) > 0 && (tree.tree[j].parent->index) < (tree.tree[i].parent->index) && Bp_ij >= 0 && B_ij >= 0 && bp_ij < 0){
		energy_t WI_ipus1_BPminus = get_WI(i+1,Bp_ij - 1) ;
		energy_t WI_Bplus_jminus = get_WI(B_ij + 1,j-1);
		m1 =   WI_ipus1_BPminus + WI_Bplus_jminus;
	}

	// 2) NOT_inArc(i) and inArc(j)
	// WI(i+1)(b(i,j)-1)+WI(b'(i,j)+1)(j-1)

	// Hosna April 9th, 2007
	// checking the borders as they may be negative
	if ((tree.tree[i].parent->index) < (tree.tree[j].parent->index) && (tree.tree[j].parent->index) > 0 && b_ij>= 0 && bp_ij >= 0 && Bp_ij < 0){
		energy_t WI_i_plus_b_minus = get_WI(i+1,b_ij - 1);
		energy_t WI_bp_plus_j_minus = get_WI(bp_ij + 1,j-1);
		m2 = WI_i_plus_b_minus + WI_bp_plus_j_minus;
	}

	// 3) inArc(i) and inArc(j)
	// WI(i+1)(B'(i,j)-1)+WI(B(i,j)+1)(b(i,j)-1)+WI(b'(i,j)+1)(j-1)

	// Hosna April 9th, 2007
	// checking the borders as they may be negative
	if((tree.tree[i].parent->index) > 0 && (tree.tree[j].parent->index) > 0 && Bp_ij >= 0 && B_ij >= 0  && b_ij >= 0 && bp_ij>= 0){
		energy_t WI_i_plus_Bp_minus = get_WI(i+1,Bp_ij - 1);
		energy_t WI_B_plus_b_minus = get_WI(B_ij + 1,b_ij - 1);
		energy_t WI_bp_plus_j_minus = get_WI(bp_ij +1,j - 1);
		m3 = WI_i_plus_Bp_minus + WI_B_plus_b_minus + WI_bp_plus_j_minus;
	}

	// 4) NOT_paired(i+1) and NOT_paired(j-1) and they can pair together
	// e_stP(i,i+1,j-1,j) + VP(i+1)(j-1)
	pair_type ptype_closingip1jm1 = pair[S_[i+1]][S_[j-1]];
	if((tree.tree[i+1].pair) < -1 && (tree.tree[j-1].pair) < -1 && ptype_closingip1jm1>0){
		m4 = get_e_stP(i,j)+ get_VP(i+1,j-1);
	}

	// 5) NOT_paired(r) and NOT_paired(rp)
	//  VP(i,j) = e_intP(i,ip,jp,j) + VP(ip,jp)
	// Hosna, April 6th, 2007
	// whenever we use get_borders we have to check for the correct values
	cand_pos_t min_borders = std::min((cand_pos_tu) Bp_ij, (cand_pos_tu) b_ij);
	cand_pos_t edge_i = std::min(i+MAXLOOP+1,j-TURN-1);
	min_borders = std::min({min_borders,edge_i});
//		printf("B'(%d,%d) = %d, b(%d,%d) = %d, min_borders = %d\n",i,j,get_Bp(i,j),i,j,get_b(i,j), min_borders);
	for (cand_pos_t k = i+1; k < min_borders; ++k){
		// Hosna: April 20, 2007
		// i and ip and j and jp should be in the same arc
		// also it should be the case that [i+1,ip-1] && [jp+1,j-1] are empty regions

		if (tree.tree[k].pair < -1 && (tree.up[(k)-1] >= ((k)-(i)-1))){
			// Hosna, April 6th, 2007
			// whenever we use get_borders we have to check for the correct values
			cand_pos_t max_borders = std::max(bp_ij,B_ij)+1;
			cand_pos_t edge_j = k+j-i-MAXLOOP-2;
			max_borders = std::max({max_borders,edge_j});
			for (cand_pos_t l = j-1; l > max_borders ; --l){

				pair_type ptype_closingkj = pair[S_[k]][S_[l]];
				if (tree.tree[l].pair < -1 && ptype_closingkj>0 && (tree.up[(j)-1] >= ((j)-(l)-1))){
					// Hosna: April 20, 2007
					// i and ip and j and jp should be in the same arc -- If it's unpaired between them, they have to be
					energy_t tmp = get_e_intP(i,k,l,j) + get_VP(k,l);
					m5 = std::min(m5,tmp);
					
				}
			}
		}
	}

		cand_pos_t min_Bp_j = std::min((cand_pos_tu) tree.b(i,j), (cand_pos_tu) tree.Bp(i,j));
		cand_pos_t max_i_bp = std::max(tree.B(i,j),tree.bp(i,j));

		for(cand_pos_t k = i+1; k<min_Bp_j; ++k){
			m6 = get_WIP(i+1,k-1) + get_VP(k,j-1);
		}
		
		m6 += ap_penalty + 2*bp_penalty;

		for(cand_pos_t k = max_i_bp+1; k<j; ++k){
			m7 = std::min(m7,get_VP(i+1,k) + get_WIP(k+1,j-1));
		}

		m7 += ap_penalty + 2*bp_penalty;

		for(cand_pos_t k = i+1; k<min_Bp_j; ++k){
			m8 =  std::min(m8,get_WIP(i+1,k-1) + get_VPR(k,j-1));
		}

		m8 += ap_penalty + 2*bp_penalty;

		for(cand_pos_t k = max_i_bp+1; k<j; ++k){
			m9 = std::min(m9,get_VPL(i+1,k) + get_WIP(k+1,j-1));
		}

		m9 += ap_penalty + 2*bp_penalty;

		



	//finding the min energy
	energy_t vp_h = std::min({m1,m2,m3});
	energy_t vp_iloop = std::min({m4,m5});
	energy_t vp_split = std::min({m6,m7,m8,m9});
	energy_t min = std::min({vp_h,vp_iloop,vp_split});

	VP[ij] = min;
	
}